

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populate
          (CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RCX;
  CommandLine<Catch::ConfigData> *in_RDX;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RSI;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *in_RDI;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *unusedTokens;
  ConfigData *in_stack_00000318;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_00000320;
  CommandLine<Catch::ConfigData> *in_stack_00000328;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *this_00;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffffa0;
  ConfigData *in_stack_ffffffffffffffb8;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_ffffffffffffffc0;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  
  this_00 = in_RDI;
  validate(in_stack_ffffffffffffffa0);
  uVar1 = 0;
  populateOptions(in_stack_00000328,in_stack_00000320,in_stack_00000318);
  populateFixedArgs(in_RDX,in_RCX,(ConfigData *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::operator=
            (this_00,in_RSI);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (this_00);
  populateFloatingArgs
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::operator=
            (this_00,in_RSI);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (this_00);
  return in_RDI;
}

Assistant:

std::vector<Parser::Token> populate( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            validate();
            std::vector<Parser::Token> unusedTokens = populateOptions( tokens, config );
            unusedTokens = populateFixedArgs( unusedTokens, config );
            unusedTokens = populateFloatingArgs( unusedTokens, config );
            return unusedTokens;
        }